

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

size_t __thiscall Memory::Recycler::ScanArena(Recycler *this,ArenaData *alloc,bool background)

{
  bool bVar1;
  BigBlock *blockp;
  BigBlock *pBVar2;
  long lVar3;
  long lVar4;
  ArenaMemoryBlock *blockp_2;
  ArenaMemoryBlock *pAVar5;
  long lVar6;
  
  bVar1 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,MarkPhase);
  if (bVar1) {
LAB_00715ee7:
    this->forceTraceMark = true;
    Output::Print(L"Scanning Guest Arena %p: ",alloc);
  }
  else {
    bVar1 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,FindRootPhase);
    if (bVar1) goto LAB_00715ee7;
  }
  if (this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
    RecyclerObjectGraphDumper::BeginDumpObject(this->objectGraphDumper,L"Guest Arena",alloc);
  }
  if (!background) {
    ArenaData::UpdateCacheBlock(alloc);
  }
  lVar6 = 0;
  for (pBVar2 = alloc->bigBlocks; pBVar2 != (BigBlock *)0x0;
      pBVar2 = (pBVar2->super_ArenaMemoryBlock).field_0.nextBigBlock) {
    lVar6 = lVar6 + pBVar2->currentByte;
    ScanMemory<false>(this,(void **)(pBVar2 + 1),pBVar2->currentByte);
  }
  lVar4 = 0;
  for (pBVar2 = alloc->fullBlocks; pBVar2 != (BigBlock *)0x0;
      pBVar2 = (pBVar2->super_ArenaMemoryBlock).field_0.nextBigBlock) {
    lVar4 = lVar4 + pBVar2->currentByte;
    ScanMemory<false>(this,(void **)(pBVar2 + 1),pBVar2->currentByte);
  }
  lVar3 = 0;
  for (pAVar5 = alloc->mallocBlocks; pAVar5 != (ArenaMemoryBlock *)0x0;
      pAVar5 = (pAVar5->field_0).next) {
    lVar3 = lVar3 + pAVar5->nbytes;
    ScanMemory<false>(this,(void **)(pAVar5 + 1),pAVar5->nbytes);
  }
  if (this->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
    RecyclerObjectGraphDumper::EndDumpObject(this->objectGraphDumper);
  }
  bVar1 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,MarkPhase);
  if (!bVar1) {
    bVar1 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,FindRootPhase);
    if (!bVar1) goto LAB_00715ffc;
  }
  this->forceTraceMark = false;
  Output::Print(L"\n");
  Output::Flush();
LAB_00715ffc:
  if ((background) || (this->recyclerFlagsTable->RecyclerProtectPagesOnRescan == false)) {
    alloc->lockBlockList = false;
  }
  return lVar4 + lVar6 + lVar3;
}

Assistant:

size_t
Recycler::ScanArena(ArenaData * alloc, bool background)
{
#if DBG_DUMP
    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
        || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
    {
        this->forceTraceMark = true;
        Output::Print(_u("Scanning Guest Arena %p: "), alloc);
    }
#endif

    size_t scanRootBytes = 0;
    BEGIN_DUMP_OBJECT_ADDRESS(_u("Guest Arena"), alloc);

#if ENABLE_PARTIAL_GC || ENABLE_CONCURRENT_GC
// The new write watch batching logic broke the write watch handling here.
// For now, just disable write watch for guest arenas.
// TODO: Re-enable this in the future.
#if FALSE
    // Note, guest arenas are allocated out of the large block page allocator.
    bool writeWatch = alloc->GetPageAllocator() == &this->recyclerLargeBlockPageAllocator;

    // Only use write watch when we are doing rescan (Partial collect or finish concurrent)
    if (writeWatch && this->collectionState == CollectionStateRescanFindRoots)
    {
        scanRootBytes += TryMarkBigBlockListWithWriteWatch(alloc->GetBigBlocks(background));
        scanRootBytes += TryMarkBigBlockListWithWriteWatch(alloc->GetFullBlocks());
    }
    else
#endif
#endif
    {
        scanRootBytes += TryMarkBigBlockList(alloc->GetBigBlocks(background));
        scanRootBytes += TryMarkBigBlockList(alloc->GetFullBlocks());
    }
    scanRootBytes += TryMarkArenaMemoryBlockList(alloc->GetMemoryBlocks());
    END_DUMP_OBJECT(this);
#if DBG_DUMP
    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::MarkPhase)
        || GetRecyclerFlagsTable().Trace.IsEnabled(Js::FindRootPhase))
    {
        this->forceTraceMark = false;
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif

    // The arena has been scanned so the full blocks can be rearranged at this point
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (background || !GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan)
#endif
    {
        alloc->SetLockBlockList(false);
    }

    return scanRootBytes;
}